

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arenas_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  uint ind;
  ctl_arena_t *pcVar1;
  ulong uVar2;
  ctl_arenas_t *pcVar3;
  int iVar4;
  undefined8 in_RAX;
  ctl_arena_t *pcVar5;
  ctl_arena_t *pcVar6;
  arena_t *paVar7;
  size_t __n;
  extent_hooks_t *extent_hooks;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar4 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  pcVar3 = ctl_arenas;
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    extent_hooks = &extent_hooks_default;
  }
  else {
    iVar4 = 0x16;
    if (newlen != 8) goto LAB_0011f2bd;
    extent_hooks = *newp;
  }
  pcVar6 = (ctl_arenas->destroyed).qlh_first;
  if ((pcVar6 == (ctl_arena_t *)0x0) ||
     (pcVar5 = (pcVar6->destroyed_link).qre_prev, pcVar5 == (ctl_arena_t *)0x0)) {
    pcVar5 = (ctl_arena_t *)&ctl_arenas->narenas;
  }
  else {
    if (pcVar6 == pcVar5) {
      pcVar6 = (pcVar6->destroyed_link).qre_next;
      (ctl_arenas->destroyed).qlh_first = pcVar6;
    }
    if (pcVar6 == pcVar5) {
      (pcVar3->destroyed).qlh_first = (ctl_arena_t *)0x0;
    }
    else {
      pcVar6 = (pcVar5->destroyed_link).qre_next;
      pcVar1 = (pcVar5->destroyed_link).qre_prev;
      (pcVar1->destroyed_link).qre_next = pcVar6;
      (pcVar6->destroyed_link).qre_prev = pcVar1;
      (pcVar5->destroyed_link).qre_next = pcVar5;
      (pcVar5->destroyed_link).qre_prev = pcVar5;
    }
  }
  ind = pcVar5->arena_ind;
  pcVar6 = arenas_i_impl(tsd,(ulong)ind,false,true);
  iVar4 = 0xb;
  if (pcVar6 != (ctl_arena_t *)0x0) {
    paVar7 = arena_init((tsdn_t *)tsd,ind,extent_hooks);
    if (paVar7 != (arena_t *)0x0) {
      if (ind == ctl_arenas->narenas) {
        ctl_arenas->narenas = ind + 1;
      }
      uStack_38 = CONCAT44(ind,(undefined4)uStack_38);
      if (ind != 0xffffffff) {
        iVar4 = 0;
        if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
          uVar2 = *oldlenp;
          if (uVar2 == 4) {
            *(uint *)oldp = ind;
            iVar4 = 0;
          }
          else {
            __n = 4;
            if (uVar2 < 4) {
              __n = uVar2;
            }
            memcpy(oldp,(void *)((long)&uStack_38 + 4),__n);
            iVar4 = 0x16;
          }
        }
      }
    }
  }
LAB_0011f2bd:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar4;
}

Assistant:

static int
arenas_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	extent_hooks_t *extent_hooks;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	extent_hooks = (extent_hooks_t *)&extent_hooks_default;
	WRITE(extent_hooks, extent_hooks_t *);
	if ((arena_ind = ctl_arena_init(tsd, extent_hooks)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}